

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MedianFunction::Deserialize
          (MedianFunction *this,Deserializer *deserializer,AggregateFunction *function)

{
  reference type;
  pointer *__ptr;
  undefined **local_140 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  QuantileBindData::Deserialize((Deserializer *)this,(AggregateFunction *)deserializer);
  type = vector<duckdb::LogicalType,_true>::operator[]
                   ((vector<duckdb::LogicalType,_true> *)&function->field_0x48,0);
  GetAggregate((AggregateFunction *)local_140,type);
  AggregateFunction::operator=(function,(AggregateFunction *)local_140);
  local_140[0] = &PTR__AggregateFunction_00897e98;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_140);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto bind_data = QuantileBindData::Deserialize(deserializer, function);

		auto &input_type = function.arguments[0];
		function = GetAggregate(input_type);
		return bind_data;
	}